

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O3

void __thiscall OpenMD::Electrostatic::calcSelfCorrection(Electrostatic *this,SelfData *sdat)

{
  pointer pEVar1;
  bool *pbVar2;
  int atid;
  int iVar3;
  ElectrostaticSummationMethod EVar4;
  pointer pEVar5;
  undefined8 uVar6;
  RealType RVar7;
  uint i;
  uint i_1;
  long lVar8;
  double *pdVar9;
  double *pdVar10;
  uint j;
  long lVar11;
  double *pdVar12;
  uint k;
  long lVar13;
  double dVar14;
  double tmp;
  double dVar15;
  RealType selfPot;
  RealType fqf;
  SquareMatrix3<double> result;
  RealType local_138;
  RealType local_130;
  double local_128;
  double local_120;
  double local_118 [10];
  undefined8 local_c8;
  double dStack_c0;
  RealType local_b8 [4];
  double local_98 [7];
  double local_60;
  double local_40;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  atid = sdat->atid;
  pEVar5 = (this->ElectrostaticMap).
           super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar3 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[atid];
  pEVar1 = pEVar5 + iVar3;
  uVar6._0_1_ = pEVar1->is_Charge;
  uVar6._1_1_ = pEVar1->is_Dipole;
  uVar6._2_1_ = pEVar1->is_Quadrupole;
  uVar6._3_1_ = pEVar1->is_Fluctuating;
  uVar6._4_1_ = pEVar1->uses_SlaterIntramolecular;
  uVar6._5_3_ = *(undefined3 *)&pEVar1->field_0x5;
  local_120 = pEVar1->fixedCharge;
  local_b8[0] = pEVar5[iVar3].hardness;
  local_b8[1] = (&pEVar5[iVar3].hardness)[1];
  local_b8[2] = *(RealType *)&pEVar5[iVar3].slaterN;
  local_b8[3] = *(RealType *)(&pEVar5[iVar3].slaterN + 2);
  local_98[2] = *(double *)((long)pEVar5[iVar3].dipole.super_Vector<double,_3U>.data_ + 0x10);
  local_98[0] = pEVar5[iVar3].dipole.super_Vector<double,_3U>.data_[0];
  local_98[1] = pEVar5[iVar3].dipole.super_Vector<double,_3U>.data_[1];
  lVar8 = 0x48;
  do {
    *(undefined8 *)((long)local_b8 + lVar8) =
         *(undefined8 *)((long)pEVar5[iVar3].dipole.super_Vector<double,_3U>.data_ + lVar8 + -0x20);
    pbVar2 = &((ElectrostaticAtomData *)(&pEVar5[iVar3].dipole + -2))->is_Charge + lVar8;
    RVar7 = *(RealType *)(pbVar2 + 8);
    *(undefined8 *)((long)&local_c8 + lVar8) = *(undefined8 *)pbVar2;
    *(RealType *)((long)&dStack_c0 + lVar8) = RVar7;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x90);
  local_138 = 0.0;
  local_130 = 0.0;
  local_128 = 0.0;
  if (uVar6._1_1_ == '\x01') {
    lVar8 = 0;
    do {
      local_128 = local_128 + local_98[lVar8] * local_98[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
  }
  if (uVar6._3_1_ != '\0') {
    dStack_c0 = local_120;
    local_120 = local_120 + sdat->flucQ;
    local_c8 = uVar6;
    FluctuatingChargeForces::getSelfInteraction(this->flucQ_,atid,sdat->flucQ,&local_138,&local_130)
    ;
  }
  EVar4 = this->summationMethod_;
  if ((EVar4 - esm_SHIFTED_POTENTIAL < 3) || (EVar4 == esm_EWALD_FULL)) {
    if ((undefined1)uVar6 != '\0') {
      dVar15 = this->selfMult1_ * this->pre11_;
      dVar14 = sdat->skippedCharge + local_120;
      local_138 = dVar14 * dVar14 * dVar15 + local_138;
      if (uVar6._3_1_ != '\0') {
        local_130 = dVar15 * -2.0 * dVar14 + local_130;
      }
    }
    if (uVar6._1_1_ != '\0') {
      local_138 = this->selfMult2_ * this->pre22_ * local_128 + local_138;
    }
    if (uVar6._2_1_ != '\0') {
      local_118[6] = 0.0;
      local_118[7] = 0.0;
      local_118[4] = 0.0;
      local_118[5] = 0.0;
      local_118[2] = 0.0;
      local_118[3] = 0.0;
      local_118[0] = 0.0;
      local_118[1] = 0.0;
      local_118[8] = 0.0;
      lVar8 = 0;
      pdVar9 = local_98 + 3;
      do {
        lVar11 = 0;
        pdVar10 = local_98 + 3;
        do {
          dVar15 = local_118[lVar8 * 3 + lVar11];
          lVar13 = 0;
          pdVar12 = pdVar10;
          do {
            dVar15 = dVar15 + pdVar9[lVar13] * *pdVar12;
            lVar13 = lVar13 + 1;
            pdVar12 = pdVar12 + 3;
          } while (lVar13 != 3);
          local_118[lVar8 * 3 + lVar11] = dVar15;
          lVar11 = lVar11 + 1;
          pdVar10 = pdVar10 + 1;
        } while (lVar11 != 3);
        lVar8 = lVar8 + 1;
        pdVar9 = pdVar9 + 3;
      } while (lVar8 != 3);
      dVar15 = local_98[3] + local_60 + local_40;
      local_118[8] = local_118[0] + local_118[4] + local_118[8];
      local_138 = (local_118[8] + local_118[8] + dVar15 * dVar15) * this->selfMult4_ * this->pre44_
                  + local_138;
      if ((undefined1)uVar6 != '\0') {
        dVar14 = this->selfMult2_ * this->pre14_;
        local_138 = local_120 * dVar14 * -2.0 * dVar15 + local_138;
        if (uVar6._3_1_ != '\0') {
          local_130 = (dVar14 + dVar14) * dVar15 + local_130;
        }
      }
    }
  }
  else if (EVar4 == esm_REACTION_FIELD) {
    if ((undefined1)uVar6 != '\0') {
      local_138 = (this->pre11_ * this->preRF_ * local_120 * local_120 * -0.5) / this->cutoffRadius_
                  + local_138;
    }
    if (uVar6._1_1_ != '\0') {
      local_138 = local_138 - this->preRF_ * this->pre22_ * local_128;
    }
  }
  (sdat->selfPot).data_[2] = (sdat->selfPot).data_[2] + local_138;
  if (sdat->isSelected == true) {
    (sdat->selePot).data_[2] = (sdat->selePot).data_[2] + local_138;
  }
  if (sdat->doParticlePot == true) {
    sdat->particlePot = local_138 + sdat->particlePot;
  }
  if (uVar6._3_1_ != '\0') {
    sdat->flucQfrc = local_130 + sdat->flucQfrc;
  }
  return;
}

Assistant:

void Electrostatic::calcSelfCorrection(SelfData& sdat) {
    if (!initialized_) initialize();

    ElectrostaticAtomData data = ElectrostaticMap[Etids[sdat.atid]];

    // logicals
    bool i_is_Charge      = data.is_Charge;
    bool i_is_Dipole      = data.is_Dipole;
    bool i_is_Quadrupole  = data.is_Quadrupole;
    bool i_is_Fluctuating = data.is_Fluctuating;
    RealType C_a          = data.fixedCharge;
    RealType selfPot(0.0), fqf(0.0), preVal, DdD(0.0), trQ, trQQ;

    if (i_is_Dipole) { DdD = data.dipole.lengthSquare(); }

    if (i_is_Fluctuating) {
      // We're now doing all of the self pieces for fluctuating charges in
      // explicit self interactions.
      C_a += sdat.flucQ;
      flucQ_->getSelfInteraction(sdat.atid, sdat.flucQ, selfPot, fqf);
    }

    switch (summationMethod_) {
    case esm_REACTION_FIELD:

      if (i_is_Charge) {
        // Self potential [see Wang and Hermans, "Reaction Field
        // Molecular Dynamics Simulation with Friedman’s Image Charge
        // Method," J. Phys. Chem. 99, 12001-12007 (1995).]
        preVal = pre11_ * preRF_ * C_a * C_a;
        selfPot -= 0.5 * preVal / cutoffRadius_;
        // if (i_is_Fluctuating) {
        //  fqf += pre11_ * preRF_ * C_a / cutoffRadius_;
        //}
      }

      if (i_is_Dipole) { selfPot -= pre22_ * preRF_ * DdD; }

      break;

    case esm_SHIFTED_FORCE:
    case esm_SHIFTED_POTENTIAL:
    case esm_TAYLOR_SHIFTED:
    case esm_EWALD_FULL:
      if (i_is_Charge) {
        selfPot += selfMult1_ * pre11_ * pow(C_a + sdat.skippedCharge, 2);
        if (i_is_Fluctuating) {
          fqf -= selfMult1_ * pre11_ * 2.0 * (C_a + sdat.skippedCharge);
        }
      }
      if (i_is_Dipole) selfPot += selfMult2_ * pre22_ * DdD;
      if (i_is_Quadrupole) {
        trQ  = data.quadrupole.trace();
        trQQ = (data.quadrupole * data.quadrupole).trace();
        selfPot += selfMult4_ * pre44_ * (2.0 * trQQ + trQ * trQ);
        if (i_is_Charge) {
          selfPot -= selfMult2_ * pre14_ * 2.0 * C_a * trQ;
          if (i_is_Fluctuating) { fqf += selfMult2_ * pre14_ * 2.0 * trQ; }
        }
      }
      break;
    default:
      break;
    }

    sdat.selfPot[ELECTROSTATIC_FAMILY] += selfPot;

    if (sdat.isSelected) sdat.selePot[ELECTROSTATIC_FAMILY] += selfPot;

    if (sdat.doParticlePot) { sdat.particlePot += selfPot; }

    if (i_is_Fluctuating) sdat.flucQfrc += fqf;
  }